

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count_signals.cpp
# Opt level: O3

int main(void)

{
  pointer ptVar1;
  slot<void_()> *value;
  __sighandler_t __handler;
  thread *thread;
  pointer ptVar2;
  int iVar3;
  atomic<int> *value_00;
  atomic<int> counter;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  signal<void_()> sig;
  long *local_e0;
  thread local_d8;
  atomic<int> local_cc;
  vector<std::thread,_std::allocator<std::thread>_> local_c8;
  signal<void_()> local_a8;
  
  local_c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super_signal_base._vptr_signal_base = (_func_int **)&PTR__signal_00106ce0;
  local_a8.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__align = 0;
  local_a8.m_slots.m_mutex_nodes.super___mutex_base._M_mutex._8_8_ = 0;
  local_a8.m_slots.m_mutex_nodes.super___mutex_base._M_mutex._16_8_ = 0;
  local_a8.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  local_a8.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_a8.m_slots.m_first._0_5_ = 0;
  local_a8.m_slots.m_first._5_3_ = 0;
  local_a8.m_slots.m_last._0_5_ = 0;
  local_a8.m_slots._53_8_ = 0;
  std::condition_variable::condition_variable(&local_a8.m_slots.m_delete_cv);
  local_cc.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  iVar3 = 100;
  do {
    value = (slot<void_()> *)operator_new(0x28);
    (value->super_slot_base)._vptr_slot_base = (_func_int **)&PTR__slot_00106d30;
    *(undefined8 *)((long)&(value->f).super__Function_base._M_functor + 8) = 0;
    *(atomic<int> **)&(value->f).super__Function_base._M_functor = &local_cc;
    (value->f)._M_invoker =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/count_signals.cpp:21:17)>
         ::_M_invoke;
    (value->f).super__Function_base._M_manager =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/count_signals.cpp:21:17)>
         ::_M_manager;
    obs::safe_list<obs::slot<void_()>_>::push_back(&local_a8.m_slots,value);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  iVar3 = 100;
  while( true ) {
    local_d8._M_id._M_thread = (id)0;
    local_e0 = (long *)operator_new(0x10);
    *local_e0 = (long)&PTR___State_00106d88;
    local_e0[1] = (long)&local_a8;
    std::thread::_M_start_thread(&local_d8,&local_e0,0);
    if (local_e0 != (long *)0x0) {
      (**(code **)(*local_e0 + 8))();
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              (&local_c8,&local_d8);
    ptVar1 = local_c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_d8._M_id._M_thread != 0) break;
    iVar3 = iVar3 + -1;
    ptVar2 = local_c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar3 == 0) {
      for (; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1) {
        std::thread::join();
      }
      local_e0 = (long *)CONCAT44(local_e0._4_4_,1000000);
      value_00 = &local_cc;
      expect_eq<int,std::atomic<int>>
                ((int *)&local_e0,value_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/count_signals.cpp"
                 ,0x24);
      obs::signal<void_()>::~signal(&local_a8,(int)value_00,__handler);
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_c8);
      return 0;
    }
  }
  std::terminate();
}

Assistant:

int main() {
  std::vector<std::thread> threads;
  obs::signal<void()> sig;

  // We need and atomic operator++()
  std::atomic<int> counter(0);

  for (int i=0; i<100; ++i) {
    sig.connect([&](){ ++counter; });
  }

  for (int i=0; i<100; ++i) {
    threads.push_back(
      std::thread(
        [&](){
          for (int i=0; i<100; ++i)
            sig();
        }));
  }

  for (auto& thread : threads)
    thread.join();

  EXPECT_EQ(100*100*100, counter);
}